

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chibicc_parse.c
# Opt level: O0

C_Node * new_sub(C_Parser *parser,C_Node *lhs,C_Node *rhs,C_Token *tok)

{
  _Bool _Var1;
  C_Node *pCVar2;
  C_Node *rhs_00;
  C_Node *node_2;
  C_Node *node_1;
  C_Node *node;
  C_Token *tok_local;
  C_Node *rhs_local;
  C_Node *lhs_local;
  C_Parser *parser_local;
  
  C_add_type(parser,lhs);
  C_add_type(parser,rhs);
  _Var1 = C_is_numeric(lhs->ty);
  if ((_Var1) && (_Var1 = C_is_numeric(rhs->ty), _Var1)) {
    parser_local = (C_Parser *)new_binary(parser,ND_SUB,lhs,rhs,tok);
  }
  else if (lhs->ty->base->kind == TY_VLA) {
    pCVar2 = new_var_node(parser,lhs->ty->base->vla_size,tok);
    pCVar2 = new_binary(parser,ND_MUL,rhs,pCVar2,tok);
    C_add_type(parser,pCVar2);
    parser_local = (C_Parser *)new_binary(parser,ND_SUB,lhs,pCVar2,tok);
    parser_local->input_files = (C_File **)lhs->ty;
  }
  else if ((lhs->ty->base == (C_Type *)0x0) || (_Var1 = C_is_integer(rhs->ty), !_Var1)) {
    if ((lhs->ty->base == (C_Type *)0x0) || (rhs->ty->base == (C_Type *)0x0)) {
      C_error_tok(parser,tok,"invalid operands");
    }
    pCVar2 = new_binary(parser,ND_SUB,lhs,rhs,tok);
    pCVar2->ty = C_ty_long;
    rhs_00 = new_num(parser,(long)lhs->ty->base->size,tok);
    parser_local = (C_Parser *)new_binary(parser,ND_DIV,pCVar2,rhs_00,tok);
  }
  else {
    pCVar2 = new_long(parser,(long)lhs->ty->base->size,tok);
    pCVar2 = new_binary(parser,ND_MUL,rhs,pCVar2,tok);
    C_add_type(parser,pCVar2);
    parser_local = (C_Parser *)new_binary(parser,ND_SUB,lhs,pCVar2,tok);
    parser_local->input_files = (C_File **)lhs->ty;
  }
  return (C_Node *)parser_local;
}

Assistant:

static C_Node *new_sub(C_Parser *parser, C_Node *lhs, C_Node *rhs, C_Token *tok) {
  C_add_type(parser, lhs);
  C_add_type(parser, rhs);

  // num - num
  if (C_is_numeric(lhs->ty) && C_is_numeric(rhs->ty))
    return new_binary(parser, ND_SUB, lhs, rhs, tok);

  // VLA + num
  if (lhs->ty->base->kind == TY_VLA) {
    rhs = new_binary(parser, ND_MUL, rhs, new_var_node(parser, lhs->ty->base->vla_size, tok), tok);
    C_add_type(parser, rhs);
    C_Node *node = new_binary(parser, ND_SUB, lhs, rhs, tok);
    node->ty = lhs->ty;
    return node;
  }

  // ptr - num
  if (lhs->ty->base && C_is_integer(rhs->ty)) {
    rhs = new_binary(parser, ND_MUL, rhs, new_long(parser, lhs->ty->base->size, tok), tok);
    C_add_type(parser, rhs);
    C_Node *node = new_binary(parser, ND_SUB, lhs, rhs, tok);
    node->ty = lhs->ty;
    return node;
  }

  // ptr - ptr, which returns how many elements are between the two.
  if (lhs->ty->base && rhs->ty->base) {
    C_Node *node = new_binary(parser, ND_SUB, lhs, rhs, tok);
    node->ty = C_ty_long;
    return new_binary(parser, ND_DIV, node, new_num(parser, lhs->ty->base->size, tok), tok);
  }

  C_error_tok(parser, tok, "invalid operands");
  return NULL;
}